

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O1

bool style_check(int sn,int style)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = gn_skill_lookup(sn);
  if ((int)uVar2 < 2) {
    bVar1 = false;
  }
  else {
    bVar1 = str_cmp(group_table[uVar2].name,style_table[style].name);
    bVar1 = !bVar1;
  }
  return bVar1;
}

Assistant:

bool style_check(int sn, int style)
{
	int gn;

	if ((gn = gn_skill_lookup(sn)) > 1)
	{
		if (str_cmp(group_table[gn].name, style_table[style].name))
			return false;
		else
			return true;
	}
	else
	{
		return false;
	}
}